

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256-sw.c
# Opt level: O3

void sha256_sw_write(BinarySink *bs,void *vp,size_t len)

{
  uint uVar1;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var2;
  BinarySink *pBVar3;
  int iVar4;
  size_t t;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  size_t __n;
  uint uVar15;
  BinarySink **ppBVar16;
  uint32_t w [64];
  uint local_174 [4];
  uint local_164;
  BinarySink **local_160;
  undefined8 local_158;
  size_t local_150;
  void *local_148;
  ulong local_140;
  uint local_138 [66];
  
  if (len != 0) {
    ppBVar16 = &bs[-4].binarysink_;
    local_160 = ppBVar16;
    local_158 = bs;
    do {
      __n = 0x40 - (long)bs[-1].writefmtv;
      if (len < __n) {
        __n = len;
      }
      memcpy(bs[-1].writefmtv + (long)ppBVar16,vp,__n);
      pBVar3 = local_158;
      p_Var2 = bs[-1].writefmtv;
      bs[-1].writefmtv = p_Var2 + __n;
      bs[-1].binarysink_ = (BinarySink *)((long)&(bs[-1].binarysink_)->write + __n);
      if (p_Var2 + __n == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x40) {
        bs[-1].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
        lVar5 = 0;
        do {
          uVar6 = *(uint *)((long)bs + lVar5 * 4 + -0x50);
          local_138[lVar5] =
               uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x10);
        lVar5 = 0x10;
        uVar6 = local_138[0];
        do {
          uVar1 = local_174[lVar5];
          uVar11 = local_138[lVar5 + -2];
          local_138[lVar5] =
               uVar6 + *(int *)((long)&local_158 + lVar5 * 4 + 4) +
               (uVar11 >> 10 ^ (uVar11 << 0xd | uVar11 >> 0x13) ^ (uVar11 << 0xf | uVar11 >> 0x11))
               + (uVar1 >> 3 ^ (uVar1 << 0xe | uVar1 >> 0x12) ^ (uVar1 << 0x19 | uVar1 >> 7));
          lVar5 = lVar5 + 1;
          uVar6 = uVar1;
        } while (lVar5 != 0x40);
        uVar6 = *(uint *)((long)&bs[-5].writefmtv + 4);
        uVar1 = *(uint *)&bs[-5].binarysink_;
        local_174[0] = *(uint *)((long)&bs[-5].binarysink_ + 4);
        local_174[1] = *(uint *)&bs[-4].write;
        local_174[2] = *(uint *)((long)&bs[-4].write + 4);
        local_174[3] = *(uint *)&bs[-4].writefmtv;
        local_164 = *(uint *)((long)&bs[-4].writefmtv + 4);
        uVar7 = 0xfffffffffffffff8;
        uVar11 = *(uint *)&bs[-5].writefmtv;
        uVar8 = uVar6;
        uVar9 = uVar1;
        uVar15 = local_174[0];
        uVar14 = local_174[1];
        uVar13 = local_174[2];
        uVar10 = local_174[3];
        uVar12 = local_164;
        do {
          iVar4 = ((uVar13 ^ uVar10) & uVar14 ^ uVar10) + uVar12 +
                  ((uVar14 << 7 | uVar14 >> 0x19) ^
                  (uVar14 << 0x15 | uVar14 >> 0xb) ^ (uVar14 << 0x1a | uVar14 >> 6)) +
                  sha256_round_constants[uVar7 + 8] + local_138[uVar7 + 8];
          uVar15 = uVar15 + iVar4;
          uVar12 = ((uVar11 | uVar8) & uVar9 | uVar11 & uVar8) +
                   ((uVar11 << 10 | uVar11 >> 0x16) ^
                   (uVar11 << 0x13 | uVar11 >> 0xd) ^ (uVar11 << 0x1e | uVar11 >> 2)) + iVar4;
          iVar4 = uVar10 + sha256_round_constants[uVar7 + 9] + local_138[uVar7 + 9] +
                  ((uVar14 ^ uVar13) & uVar15 ^ uVar13) +
                  ((uVar15 * 0x80 | uVar15 >> 0x19) ^
                  (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6));
          uVar9 = uVar9 + iVar4;
          uVar10 = iVar4 + ((uVar12 | uVar11) & uVar8 | uVar12 & uVar11) +
                           ((uVar12 * 0x400 | uVar12 >> 0x16) ^
                           (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2))
          ;
          iVar4 = uVar13 + sha256_round_constants[uVar7 + 10] + local_138[uVar7 + 10] +
                  ((uVar15 ^ uVar14) & uVar9 ^ uVar14) +
                  ((uVar9 * 0x80 | uVar9 >> 0x19) ^
                  (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6));
          uVar8 = uVar8 + iVar4;
          uVar13 = iVar4 + ((uVar10 | uVar12) & uVar11 | uVar10 & uVar12) +
                           ((uVar10 * 0x400 | uVar10 >> 0x16) ^
                           (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2))
          ;
          iVar4 = uVar14 + sha256_round_constants[uVar7 + 0xb] + local_138[uVar7 + 0xb] +
                  ((uVar9 ^ uVar15) & uVar8 ^ uVar15) +
                  ((uVar8 * 0x80 | uVar8 >> 0x19) ^
                  (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6));
          uVar11 = uVar11 + iVar4;
          uVar14 = iVar4 + ((uVar13 | uVar10) & uVar12 | uVar13 & uVar10) +
                           ((uVar13 * 0x400 | uVar13 >> 0x16) ^
                           (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2))
          ;
          iVar4 = uVar15 + sha256_round_constants[uVar7 + 0xc] + local_138[uVar7 + 0xc] +
                  ((uVar8 ^ uVar9) & uVar11 ^ uVar9) +
                  ((uVar11 * 0x80 | uVar11 >> 0x19) ^
                  (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6));
          uVar12 = uVar12 + iVar4;
          uVar15 = ((uVar14 | uVar13) & uVar10 | uVar14 & uVar13) +
                   ((uVar14 * 0x400 | uVar14 >> 0x16) ^
                   (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar4
          ;
          iVar4 = uVar9 + sha256_round_constants[uVar7 + 0xd] + local_138[uVar7 + 0xd] +
                  ((uVar11 ^ uVar8) & uVar12 ^ uVar8) +
                  ((uVar12 * 0x80 | uVar12 >> 0x19) ^
                  (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6));
          uVar10 = uVar10 + iVar4;
          uVar9 = ((uVar15 | uVar14) & uVar13 | uVar15 & uVar14) +
                  ((uVar15 * 0x400 | uVar15 >> 0x16) ^
                  (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar4;
          iVar4 = local_138[uVar7 + 0xe] + sha256_round_constants[uVar7 + 0xe] + uVar8 +
                  ((uVar12 ^ uVar11) & uVar10 ^ uVar11) +
                  ((uVar10 * 0x80 | uVar10 >> 0x19) ^
                  (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6));
          uVar13 = uVar13 + iVar4;
          uVar8 = ((uVar9 | uVar15) & uVar14 | uVar9 & uVar15) +
                  ((uVar9 * 0x400 | uVar9 >> 0x16) ^
                  (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar4;
          iVar4 = local_138[uVar7 + 0xf] + sha256_round_constants[uVar7 + 0xf] + uVar11 +
                  ((uVar10 ^ uVar12) & uVar13 ^ uVar12) +
                  ((uVar13 * 0x80 | uVar13 >> 0x19) ^
                  (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6));
          uVar14 = uVar14 + iVar4;
          uVar11 = ((uVar8 | uVar9) & uVar15 | uVar8 & uVar9) +
                   ((uVar8 * 0x400 | uVar8 >> 0x16) ^
                   (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar4;
          uVar7 = uVar7 + 8;
        } while (uVar7 < 0x38);
        *(uint *)&local_158[-5].writefmtv = uVar11 + *(uint *)&bs[-5].writefmtv;
        *(uint *)((long)&local_158[-5].writefmtv + 4) = uVar8 + uVar6;
        *(uint *)&local_158[-5].binarysink_ = uVar9 + uVar1;
        *(uint *)((long)&local_158[-5].binarysink_ + 4) = uVar15 + local_174[0];
        *(uint *)&local_158[-4].write = uVar14 + local_174[1];
        *(uint *)((long)&local_158[-4].write + 4) = uVar13 + local_174[2];
        *(uint *)&local_158[-4].writefmtv = uVar10 + local_174[3];
        *(uint *)((long)&local_158[-4].writefmtv + 4) = uVar12 + local_164;
        local_150 = __n;
        local_148 = vp;
        local_140 = len;
        smemclr(local_138,0x100);
        len = local_140;
        __n = local_150;
        bs = pBVar3;
        vp = local_148;
        ppBVar16 = local_160;
      }
      vp = (void *)((long)vp + __n);
      len = len - __n;
    } while (len != 0);
  }
  return;
}

Assistant:

static void sha256_sw_write(BinarySink *bs, const void *vp, size_t len)
{
    sha256_sw *s = BinarySink_DOWNCAST(bs, sha256_sw);

    while (len > 0)
        if (sha256_block_write(&s->blk, &vp, &len))
            sha256_sw_block(s->core, s->blk.block);
}